

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupHalfSeq(Gia_Man_t *p,int fSecond)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pName = pcVar7;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pSpec = pcVar7;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  if (fSecond == 0) {
    iVar13 = p->nRegs;
    pVVar8 = p->vCis;
    iVar11 = pVVar8->nSize;
    if (iVar13 < iVar11) {
      lVar12 = 0;
      do {
        if (iVar11 <= lVar12) goto LAB_001f6c5d;
        iVar11 = pVVar8->pArray[lVar12];
        if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_001f6c1f;
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        pGVar9 = Gia_ManAppendObj(p_00);
        uVar4 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar4 | 0x9fffffff;
        *(ulong *)pGVar9 =
             uVar4 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar5 = p_00->pObjs;
        if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) goto LAB_001f6c3e;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * -0x55555555);
        pGVar5 = p_00->pObjs;
        if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) goto LAB_001f6c3e;
        pGVar3[iVar11].Value = (int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * 0x55555556;
        lVar12 = lVar12 + 1;
        iVar13 = p->nRegs;
        pVVar8 = p->vCis;
        iVar11 = pVVar8->nSize;
      } while (lVar12 < iVar11 - iVar13);
    }
    if (0 < iVar13) {
      iVar11 = 0;
      do {
        iVar1 = p->vCis->nSize;
        uVar10 = (iVar1 - iVar13) + iVar11;
        if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) goto LAB_001f6c5d;
        iVar1 = p->vCis->pArray[uVar10];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001f6c1f;
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        if (iVar13 / 2 <= iVar11) {
          pGVar9 = Gia_ManAppendObj(p_00);
          uVar4 = *(ulong *)pGVar9;
          *(ulong *)pGVar9 = uVar4 | 0x9fffffff;
          *(ulong *)pGVar9 =
               uVar4 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar5 = p_00->pObjs;
          if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) goto LAB_001f6c3e;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * -0x55555555);
          pGVar5 = p_00->pObjs;
          if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) goto LAB_001f6c3e;
          pGVar3[iVar1].Value = (int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * 0x55555556;
          iVar13 = p->nRegs;
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 < iVar13);
      if (0 < iVar13) {
        iVar11 = 0;
        do {
          iVar1 = p->vCis->nSize;
          uVar10 = (iVar1 - iVar13) + iVar11;
          if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) goto LAB_001f6c5d;
          iVar1 = p->vCis->pArray[uVar10];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001f6c1f;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          if (iVar11 < iVar13 / 2) {
            pGVar9 = Gia_ManAppendObj(p_00);
            uVar4 = *(ulong *)pGVar9;
            *(ulong *)pGVar9 = uVar4 | 0x9fffffff;
            *(ulong *)pGVar9 =
                 uVar4 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar5 = p_00->pObjs;
            if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) goto LAB_001f6c3e;
            Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * -0x55555555);
            pGVar5 = p_00->pObjs;
            if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) goto LAB_001f6c3e;
            pGVar3[iVar1].Value = (int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * 0x55555556;
            iVar13 = p->nRegs;
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 < iVar13);
      }
    }
    pVVar8 = p->vCos;
    iVar11 = pVVar8->nSize;
    if (iVar13 < iVar11) {
      lVar12 = 0;
      do {
        if (iVar11 <= lVar12) goto LAB_001f6c5d;
        iVar11 = pVVar8->pArray[lVar12];
        if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_001f6c1f;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        Gia_ManDupOrderDfs_rec(p_00,p,p->pObjs + iVar11);
        lVar12 = lVar12 + 1;
        iVar13 = p->nRegs;
        pVVar8 = p->vCos;
        iVar11 = pVVar8->nSize;
      } while (lVar12 < iVar11 - iVar13);
    }
    if (0 < iVar13) {
      iVar11 = 0;
      do {
        iVar1 = p->vCos->nSize;
        uVar10 = (iVar1 - iVar13) + iVar11;
        if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) goto LAB_001f6c5d;
        iVar1 = p->vCos->pArray[uVar10];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001f6c1f;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (iVar11 < iVar13 / 2) {
          Gia_ManDupOrderDfs_rec(p_00,p,p->pObjs + iVar1);
          iVar13 = p->nRegs;
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 < iVar13);
    }
    iVar13 = iVar13 / 2;
  }
  else {
    pVVar8 = p->vCis;
    if (0 < pVVar8->nSize) {
      lVar12 = 0;
      do {
        iVar13 = pVVar8->pArray[lVar12];
        if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_001f6c1f;
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        pGVar9 = Gia_ManAppendObj(p_00);
        uVar4 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar4 | 0x9fffffff;
        *(ulong *)pGVar9 =
             uVar4 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar5 = p_00->pObjs;
        if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) {
LAB_001f6c3e:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * -0x55555555);
        pGVar5 = p_00->pObjs;
        if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) goto LAB_001f6c3e;
        pGVar3[iVar13].Value = (int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * 0x55555556;
        lVar12 = lVar12 + 1;
        pVVar8 = p->vCis;
      } while (lVar12 < pVVar8->nSize);
    }
    iVar13 = p->nRegs;
    pVVar8 = p->vCos;
    iVar11 = pVVar8->nSize;
    if (iVar13 < iVar11) {
      lVar12 = 0;
      do {
        if (iVar11 <= lVar12) goto LAB_001f6c5d;
        iVar11 = pVVar8->pArray[lVar12];
        if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_001f6c1f;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        Gia_ManDupOrderDfs_rec(p_00,p,p->pObjs + iVar11);
        lVar12 = lVar12 + 1;
        iVar13 = p->nRegs;
        pVVar8 = p->vCos;
        iVar11 = pVVar8->nSize;
      } while (lVar12 < iVar11 - iVar13);
    }
    if (0 < iVar13) {
      iVar11 = 0;
      do {
        iVar1 = p->vCos->nSize;
        uVar10 = (iVar1 - iVar13) + iVar11;
        if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) {
LAB_001f6c5d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = p->vCos->pArray[uVar10];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_001f6c1f:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (iVar13 / 2 <= iVar11) {
          Gia_ManDupOrderDfs_rec(p_00,p,p->pObjs + iVar1);
          iVar13 = p->nRegs;
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 < iVar13);
    }
    iVar13 = iVar13 - iVar13 / 2;
  }
  Gia_ManSetRegNum(p_00,iVar13);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupHalfSeq( Gia_Man_t * p, int fSecond )
{
    int i; Gia_Obj_t * pObj;
    Gia_Man_t * pNew = Gia_ManStart( Gia_ManObjNum(p) ); 
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    if ( fSecond )
    {
        Gia_ManForEachCi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachPo( p, pObj, i )
            Gia_ManDupOrderDfs_rec( pNew, p, pObj );
        Gia_ManForEachRi( p, pObj, i )
            if ( i >= Gia_ManRegNum(p)/2 )
                Gia_ManDupOrderDfs_rec( pNew, p, pObj );
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p)- Gia_ManRegNum(p)/2 );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachRo( p, pObj, i )
            if ( i >= Gia_ManRegNum(p)/2 )
                pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachRo( p, pObj, i )
            if ( i < Gia_ManRegNum(p)/2 )
                pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachPo( p, pObj, i )
            Gia_ManDupOrderDfs_rec( pNew, p, pObj );
        Gia_ManForEachRi( p, pObj, i )
            if ( i < Gia_ManRegNum(p)/2 )
                Gia_ManDupOrderDfs_rec( pNew, p, pObj );
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p)/2 );
    }
    return pNew;
}